

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O3

void iutest::TestEnv::set_stream_result_to(char *str)

{
  Variable *pVVar1;
  char *__s;
  allocator<char> local_29;
  long *local_28 [2];
  long local_18 [2];
  
  __s = "";
  if (str != (char *)0x0) {
    __s = str;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,__s,&local_29);
  pVVar1 = get_vars();
  std::__cxx11::string::_M_assign((string *)&(pVVar1->m_stream_result_to).m_value);
  (pVVar1->m_stream_result_to).m_dirty = true;
  if (local_28[0] != local_18) {
    operator_delete(local_28[0],local_18[0] + 1);
  }
  return;
}

Assistant:

static bool IsEnableFlag(int flag) { return (GetInstance().m_test_flags & flag) ? true : false; }